

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O2

void __thiscall
iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test::Body
          (iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this)

{
  bool bVar1;
  Fixed *fixed;
  char *message;
  char16_t **in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  char16_t *p;
  AssertionResult iutest_ar;
  string s;
  LogChecker ck;
  char16_t *val;
  iuCodeMessage local_270;
  string local_240;
  AssertionResult local_220;
  string local_1f8;
  LogChecker local_1d8;
  Fixed local_190;
  
  val = L"𠮷";
  iutest::PrintToString<char16_t_const*>(&local_1f8,(iutest *)&stack0xfffffffffffffd88,in_RDX);
  if (*local_1f8._M_dataplus._M_p == '?') {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    bVar1 = iutest::UnitTestImpl::SkipTest();
    message = "Skipped. but already failed. ";
    if (bVar1) {
      message = "Skipped. ";
    }
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
               ,0x170,message);
    local_1d8.printer_logger.m_log._M_dataplus._M_p._4_4_ = 0xfffffffe;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  else {
    LogChecker::LogChecker(&local_1d8,anon_var_dwarf_327af);
    iutest::PrintToString<std::__cxx11::string>(&local_240,(iutest *)&local_1f8,v);
    iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
              (&local_220,(internal *)"static_cast<const char*>(ck)","::iutest::PrintToString(s)",
               local_1d8.super_LogCheckerBase.m_str._M_dataplus._M_p,(char *)&local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,(type **)val);
    std::__cxx11::string::~string((string *)&local_240);
    if (local_220.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
                 ,0x177,local_220.m_message._M_dataplus._M_p);
      local_270._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_270,&local_190);
      std::__cxx11::string::~string((string *)&local_270);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_220);
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_190,val);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
               ,0x178,"Succeeded.\n");
    local_270._44_4_ = 0;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_270,fixed);
    std::__cxx11::string::~string((string *)&local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    LogChecker::~LogChecker(&local_1d8);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

IUTEST(PrintToTest, SurrogatePairChar16T)
{
    const char16_t* p = u"\U00020BB7";
    const ::std::string s = ::iutest::PrintToString(p);
    if( s[0] == '?' )
    {
        // FIXME
        IUTEST_SKIP();
    }
    else
    {
#if !defined(NO_TEST_SURROGATEPAIR)
        LogChecker ck("\U00020BB7");
        (void)ck;
        IUTEST_PRINTTOSTRING_EQ(ck, s);
        IUTEST_STREAMOUT_CHECK(p);
#endif
    }
}